

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractslider.cpp
# Opt level: O0

bool __thiscall QAbstractSlider::event(QAbstractSlider *this,QEvent *e)

{
  bool bVar1;
  QEvent *in_stack_00000138;
  QWidget *in_stack_00000140;
  
  bVar1 = QWidget::event(in_stack_00000140,in_stack_00000138);
  return bVar1;
}

Assistant:

bool QAbstractSlider::event(QEvent *e)
{
#ifdef QT_KEYPAD_NAVIGATION
    Q_D(QAbstractSlider);
    switch (e->type()) {
    case QEvent::FocusIn:
        d->origValue = d->value;
        break;
    default:
        break;
    }
#endif

    return QWidget::event(e);
}